

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

int bmpTest(void)

{
  int iVar1;
  int format;
  int height;
  int width;
  int align;
  int in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  int in_stack_000000c0;
  int in_stack_000000c4;
  char *in_stack_000000c8;
  int local_14;
  uint local_8;
  
  local_8 = 1;
  do {
    if (8 < (int)local_8) {
      return 0;
    }
    for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
      printf("%s Top-Down BMP (row alignment = %d bytes)  ...  ",pixFormatStr[local_14],
             (ulong)local_8);
      iVar1 = doBmpTest(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                        in_stack_000000b8,in_stack_000000b4);
      if (iVar1 == -1) {
        return -1;
      }
      printf("OK.\n");
      printf("%s Top-Down PPM (row alignment = %d bytes)  ...  ",pixFormatStr[local_14],
             (ulong)local_8);
      iVar1 = doBmpTest(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                        in_stack_000000b8,in_stack_000000b4);
      if (iVar1 == -1) {
        return -1;
      }
      printf("OK.\n");
      printf("%s Bottom-Up BMP (row alignment = %d bytes)  ...  ",pixFormatStr[local_14],
             (ulong)local_8);
      iVar1 = doBmpTest(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                        in_stack_000000b8,in_stack_000000b4);
      if (iVar1 == -1) {
        return -1;
      }
      printf("OK.\n");
      printf("%s Bottom-Up PPM (row alignment = %d bytes)  ...  ",pixFormatStr[local_14],
             (ulong)local_8);
      iVar1 = doBmpTest(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,
                        in_stack_000000b8,in_stack_000000b4);
      if (iVar1 == -1) {
        return -1;
      }
      printf("OK.\n");
    }
    local_8 = local_8 << 1;
  } while( true );
}

Assistant:

static int bmpTest(void)
{
  int align, width = 35, height = 39, format;

  for (align = 1; align <= 8; align *= 2) {
    for (format = 0; format < TJ_NUMPF; format++) {
      printf("%s Top-Down BMP (row alignment = %d bytes)  ...  ",
             pixFormatStr[format], align);
      if (doBmpTest("bmp", width, align, height, format, 0) == -1)
        return -1;
      printf("OK.\n");

      printf("%s Top-Down PPM (row alignment = %d bytes)  ...  ",
             pixFormatStr[format], align);
      if (doBmpTest("ppm", width, align, height, format,
                    TJFLAG_BOTTOMUP) == -1)
        return -1;
      printf("OK.\n");

      printf("%s Bottom-Up BMP (row alignment = %d bytes)  ...  ",
             pixFormatStr[format], align);
      if (doBmpTest("bmp", width, align, height, format, 0) == -1)
        return -1;
      printf("OK.\n");

      printf("%s Bottom-Up PPM (row alignment = %d bytes)  ...  ",
             pixFormatStr[format], align);
      if (doBmpTest("ppm", width, align, height, format,
                    TJFLAG_BOTTOMUP) == -1)
        return -1;
      printf("OK.\n");
    }
  }

  return 0;
}